

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectAnimationKey(CXMeshFileLoader *this,SJoint *joint)

{
  undefined1 *puVar1;
  long *plVar2;
  bool bVar3;
  u32 uVar4;
  u32 uVar5;
  u32 uVar6;
  float *pfVar7;
  char *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Da_01;
  float fVar9;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  f32 fVar10;
  f32 fVar11;
  f32 fVar12;
  f32 fVar13;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  matrix4 mat;
  CMatrix4<float> t;
  quaternion local_40;
  
  bVar3 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar3) {
    uVar4 = readInt(this);
    if (uVar4 < 5) {
      uVar5 = readInt(this);
      if (uVar5 == 0) {
        checkForOneFollowingSemicolons(this);
      }
      while (bVar3 = uVar5 != 0, uVar5 = uVar5 - 1, bVar3) {
        uVar6 = readInt(this);
        fVar9 = (float)uVar6;
        if (uVar4 - 1 < 2) {
          uVar6 = readInt(this);
          if (uVar6 != 3) {
            this_00 = "Expected 3 numbers in animation key in x file";
            uVar8 = extraout_XMM0_Da_05;
            uVar14 = extraout_XMM0_Db_05;
            goto LAB_001df9a5;
          }
          t.M[0] = 0.0;
          t.M[1] = 0.0;
          t.M[2] = 0.0;
          readVector3(this,(vector3df *)&t);
          bVar3 = checkForTwoFollowingSemicolons(this);
          if (!bVar3) {
            os::Printer::log((Printer *)
                             "No finishing semicolon after vector animation key in x file",
                             (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
            core::string<char>::string((string<char> *)&mat,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
            ::std::__cxx11::string::_M_dispose();
          }
          plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
          pfVar7 = (float *)(**(code **)(*plVar2 + (ulong)(uVar4 != 2) * 8 + 0x108))(plVar2,joint);
          *pfVar7 = fVar9;
          *(undefined8 *)(pfVar7 + 1) = t.M._0_8_;
          pfVar7[3] = t.M[2];
        }
        else if (uVar4 - 3 < 2) {
          uVar6 = readInt(this);
          if (uVar6 != 0x10) {
            this_00 = "Expected 16 numbers in animation key in x file";
            uVar8 = extraout_XMM0_Da_02;
            uVar14 = extraout_XMM0_Db_02;
            goto LAB_001df9a5;
          }
          readMatrix(this,&mat);
          bVar3 = checkForOneFollowingSemicolons(this);
          if (!bVar3) {
            os::Printer::log((Printer *)
                             "No finishing semicolon after matrix animation key in x file",
                             (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            core::string<char>::string((string<char> *)&t,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
            ::std::__cxx11::string::_M_dispose();
          }
          plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
          pfVar7 = (float *)(**(code **)(*plVar2 + 0x118))(plVar2,joint);
          *pfVar7 = fVar9;
          t.M[1] = mat.M[4];
          t.M[0] = mat.M[0];
          t.M[2] = mat.M[8];
          t.M[3] = mat.M[0xc];
          t.M[4] = mat.M[1];
          t.M[5] = mat.M[5];
          t.M[6] = mat.M[9];
          t.M[7] = mat.M[0xd];
          t.M[8] = mat.M[2];
          t.M[9] = mat.M[6];
          t.M[10] = mat.M[10];
          t.M[0xb] = mat.M[0xe];
          t.M[0xc] = mat.M[3];
          t.M[0xd] = mat.M[7];
          t.M[0xe] = mat.M[0xb];
          t.M[0xf] = mat.M[0xf];
          core::quaternion::operator=(&local_40,&t);
          pfVar7[1] = (float)local_40.X;
          pfVar7[2] = (float)local_40.Y;
          pfVar7[3] = (float)local_40.Z;
          pfVar7[4] = (float)local_40.W;
          plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
          pfVar7 = (float *)(**(code **)(*plVar2 + 0x108))(plVar2,joint);
          *pfVar7 = fVar9;
          pfVar7[1] = mat.M[0xc];
          pfVar7[2] = mat.M[0xd];
          pfVar7[3] = mat.M[0xe];
        }
        else {
          uVar6 = readInt(this);
          if (uVar6 != 4) {
            this_00 = "Expected 4 numbers in animation key in x file";
            uVar8 = extraout_XMM0_Da_08;
            uVar14 = extraout_XMM0_Db_08;
            goto LAB_001df9a5;
          }
          fVar10 = readFloat(this);
          fVar11 = readFloat(this);
          fVar12 = readFloat(this);
          fVar13 = readFloat(this);
          bVar3 = checkForTwoFollowingSemicolons(this);
          if (!bVar3) {
            os::Printer::log((Printer *)
                             "No finishing semicolon after quaternion animation key in x file",
                             (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
            core::string<char>::string((string<char> *)&mat,this->Line);
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
            ::std::__cxx11::string::_M_dispose();
          }
          plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
          pfVar7 = (float *)(**(code **)(*plVar2 + 0x118))(plVar2,joint);
          *pfVar7 = fVar9;
          *(ulong *)(pfVar7 + 1) = CONCAT44(fVar12,fVar11) ^ 0x8000000080000000;
          *(ulong *)(pfVar7 + 3) = CONCAT44(fVar10,fVar13) ^ 0x8000000080000000;
          core::quaternion::normalize((quaternion *)(pfVar7 + 1));
        }
      }
      bVar3 = checkForOneFollowingSemicolons(this);
      if (!bVar3) {
        puVar1 = &(this->super_IMeshLoader).field_0x18;
        *(long *)puVar1 = *(long *)puVar1 + -1;
      }
      bVar3 = checkForClosingBrace(this);
      if (bVar3) {
        return true;
      }
      this_00 = "No closing brace in animation key in x file";
      uVar8 = extraout_XMM0_Da_11;
      uVar14 = extraout_XMM0_Db_11;
    }
    else {
      this_00 = "Unknown key type found in Animation Key in x file";
      uVar8 = extraout_XMM0_Da_00;
      uVar14 = extraout_XMM0_Db_00;
    }
  }
  else {
    this_00 = "No opening brace in Animation Key found in x file";
    uVar8 = extraout_XMM0_Da;
    uVar14 = extraout_XMM0_Db;
  }
LAB_001df9a5:
  os::Printer::log((Printer *)this_00,(double)CONCAT44(uVar14,uVar8));
  core::string<char>::string((string<char> *)&mat,this->Line);
  os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  ::std::__cxx11::string::_M_dispose();
  this->ErrorState = true;
  return false;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectAnimationKey(ISkinnedMesh::SJoint *joint)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading animation key", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Animation Key found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read key type

	const u32 keyType = readInt();

	if (keyType > 4) {
		os::Printer::log("Unknown key type found in Animation Key in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read number of keys
	const u32 numberOfKeys = readInt();

	// eat the semicolon after the "0".  if there are keys present, readInt()
	// does this for us.  If there aren't, we need to do it explicitly
	if (numberOfKeys == 0)
		checkForOneFollowingSemicolons();

	for (u32 i = 0; i < numberOfKeys; ++i) {
		// read time
		const f32 time = (f32)readInt();

		// read keys
		switch (keyType) {
		case 0: // rotation
		{
			// read quaternions

			// read count
			if (readInt() != 4) {
				os::Printer::log("Expected 4 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			f32 W = -readFloat();
			f32 X = -readFloat();
			f32 Y = -readFloat();
			f32 Z = -readFloat();

			if (!checkForTwoFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after quaternion animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			ISkinnedMesh::SRotationKey *key = AnimatedMesh->addRotationKey(joint);
			key->frame = time;
			key->rotation.set(X, Y, Z, W);
			key->rotation.normalize();
		} break;
		case 1: // scale
		case 2: // position
		{
			// read vectors

			// read count
			if (readInt() != 3) {
				os::Printer::log("Expected 3 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			core::vector3df vector;
			readVector3(vector);

			if (!checkForTwoFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after vector animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			if (keyType == 2) {
				ISkinnedMesh::SPositionKey *key = AnimatedMesh->addPositionKey(joint);
				key->frame = time;
				key->position = vector;
			} else {
				ISkinnedMesh::SScaleKey *key = AnimatedMesh->addScaleKey(joint);
				key->frame = time;
				key->scale = vector;
			}
		} break;
		case 3:
		case 4: {
			// read matrix

			// read count
			if (readInt() != 16) {
				os::Printer::log("Expected 16 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read matrix
			core::matrix4 mat(core::matrix4::EM4CONST_NOTHING);
			readMatrix(mat);

			// mat=joint->LocalMatrix*mat;

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after matrix animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			// core::vector3df rotation = mat.getRotationDegrees();

			ISkinnedMesh::SRotationKey *keyR = AnimatedMesh->addRotationKey(joint);
			keyR->frame = time;

			// IRR_TEST_BROKEN_QUATERNION_USE: TODO - switched from mat to mat.getTransposed() for downward compatibility.
			// Not tested so far if this was correct or wrong before quaternion fix!
			keyR->rotation = core::quaternion(mat.getTransposed());

			ISkinnedMesh::SPositionKey *keyP = AnimatedMesh->addPositionKey(joint);
			keyP->frame = time;
			keyP->position = mat.getTranslation();

			/*
							core::vector3df scale=mat.getScale();

							if (scale.X==0)
								scale.X=1;
							if (scale.Y==0)
								scale.Y=1;
							if (scale.Z==0)
								scale.Z=1;
							ISkinnedMesh::SScaleKey *keyS=AnimatedMesh->addScaleKey(joint);
							keyS->frame=time;
							keyS->scale=scale;
			*/
		} break;
		} // end switch
	}

	if (!checkForOneFollowingSemicolons())
		--P;

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in animation key in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}